

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> __thiscall
wabt::MakeUnique<wabt::FuncModuleField,wabt::Location&,std::__cxx11::string&>
          (wabt *this,Location *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  string_view name;
  FuncModuleField *this_00;
  
  this_00 = (FuncModuleField *)operator_new(0x148);
  name.data_ = (args_1->_M_dataplus)._M_p;
  name.size_ = args_1->_M_string_length;
  FuncModuleField::FuncModuleField(this_00,args,name);
  *(FuncModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}